

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

Char * Diligent::GetValueTypeString(VALUE_TYPE Val)

{
  char *pcVar1;
  char (*in_R8) [2];
  string msg;
  uint local_2c;
  string local_28;
  
  if (GetValueTypeString(Diligent::VALUE_TYPE)::ValueTypeStrings == '\0') {
    GetValueTypeString();
  }
  if (Val < VT_NUM_TYPES) {
    pcVar1 = GetValueTypeString::ValueTypeStrings.ValueTypeStrings._M_elems[Val];
  }
  else {
    local_2c = (uint)Val;
    FormatString<char[23],unsigned_int,char[2]>
              (&local_28,(Diligent *)"Incorrect value type (",(char (*) [23])&local_2c,
               (uint *)0x73bf31,in_R8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x47);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = "unknown value type";
  }
  return pcVar1;
}

Assistant:

const Char* GetValueTypeString(VALUE_TYPE Val)
{
    struct ValueTypeToStringMap
    {
        ValueTypeToStringMap()
        {
#define INIT_VALUE_TYPE_STR(ValType) ValueTypeStrings[ValType] = #ValType
            INIT_VALUE_TYPE_STR(VT_UNDEFINED);
            INIT_VALUE_TYPE_STR(VT_INT8);
            INIT_VALUE_TYPE_STR(VT_INT16);
            INIT_VALUE_TYPE_STR(VT_INT32);
            INIT_VALUE_TYPE_STR(VT_UINT8);
            INIT_VALUE_TYPE_STR(VT_UINT16);
            INIT_VALUE_TYPE_STR(VT_UINT32);
            INIT_VALUE_TYPE_STR(VT_FLOAT16);
            INIT_VALUE_TYPE_STR(VT_FLOAT32);
            INIT_VALUE_TYPE_STR(VT_FLOAT64);
#undef INIT_VALUE_TYPE_STR
            static_assert(VT_NUM_TYPES == 10, "Not all value type strings are initialized.");
        }

        const Char* operator[](VALUE_TYPE Val) const
        {
            if (Val < ValueTypeStrings.size())
            {
                return ValueTypeStrings[Val];
            }
            else
            {
                UNEXPECTED("Incorrect value type (", static_cast<Uint32>(Val), ")");
                return "unknown value type";
            }
        }

    private:
        std::array<const Char*, VT_NUM_TYPES> ValueTypeStrings{};
    };

    static const ValueTypeToStringMap ValueTypeStrings;
    return ValueTypeStrings[Val];
}